

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::readSettings(UEFITool *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  PrivateShared *pPVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  parameter_type pVar8;
  int iVar9;
  QArrayDataPointer<char16_t> local_118;
  anon_union_24_3_e3d07ef4_for_data local_f8;
  anon_union_24_3_e3d07ef4_for_data local_d8;
  undefined8 local_c0;
  QSettings settings;
  QList<int> vertList;
  QList<int> horList;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  QSettings::QSettings(&settings,(QObject *)this);
  QString::QString((QString *)&vertList,"mainWindow/geometry");
  local_d8.shared = (PrivateShared *)0x0;
  local_d8._8_8_ = 0;
  local_d8._16_8_ = 0;
  local_c0 = 2;
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  QVariant::toByteArray();
  QWidget::restoreGeometry((QByteArray *)this);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&horList);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&vertList);
  QString::QString((QString *)&vertList,"mainWindow/windowState");
  local_d8.shared = (PrivateShared *)0x0;
  local_d8._8_8_ = 0;
  local_d8._16_8_ = 0;
  local_c0 = 2;
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  QVariant::toByteArray();
  QMainWindow::restoreState((QByteArray *)this,(int)&horList);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&horList);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&vertList);
  horList.d.d = (Data *)0x0;
  horList.d.ptr = (int *)0x0;
  horList.d.size = 0;
  vertList.d.d = (Data *)0x0;
  vertList.d.ptr = (int *)0x0;
  vertList.d.size = 0;
  QString::QString((QString *)&local_118,"mainWindow/treeWidth");
  QVariant::QVariant((QVariant *)&local_d8,600);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  pVar8 = QVariant::toInt((bool *)local_f8.data);
  QList<int>::append(&horList,pVar8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QString::QString((QString *)&local_118,"mainWindow/infoWidth");
  QVariant::QVariant((QVariant *)&local_d8,0xb4);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  pVar8 = QVariant::toInt((bool *)local_f8.data);
  QList<int>::append(&horList,pVar8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QString::QString((QString *)&local_118,"mainWindow/treeHeight");
  QVariant::QVariant((QVariant *)&local_d8,400);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  pVar8 = QVariant::toInt((bool *)local_f8.data);
  QList<int>::append(&vertList,pVar8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QString::QString((QString *)&local_118,"mainWindow/messageHeight");
  QVariant::QVariant((QVariant *)&local_d8,0xb4);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  pVar8 = QVariant::toInt((bool *)local_f8.data);
  QList<int>::append(&vertList,pVar8);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QSplitter::setSizes(*(QList **)(this->ui + 0x118));
  QSplitter::setSizes(*(QList **)(this->ui + 0x110));
  uVar2 = *(undefined8 *)(this->ui + 0x130);
  QString::QString((QString *)&local_118,"tree/columnWidth0");
  iVar9 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_d8,iVar9);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar2,0);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  uVar2 = *(undefined8 *)(this->ui + 0x130);
  QString::QString((QString *)&local_118,"tree/columnWidth1");
  iVar9 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_d8,iVar9);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar2,1);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  uVar2 = *(undefined8 *)(this->ui + 0x130);
  QString::QString((QString *)&local_118,"tree/columnWidth2");
  iVar9 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_d8,iVar9);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar2,2);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  uVar2 = *(undefined8 *)(this->ui + 0x130);
  QString::QString((QString *)&local_118,"tree/columnWidth3");
  iVar9 = QTreeView::columnWidth((int)*(undefined8 *)(this->ui + 0x130));
  QVariant::QVariant((QVariant *)&local_d8,iVar9);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  QVariant::toInt((bool *)local_f8.data);
  QTreeView::setColumnWidth((int)uVar2,3);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QString::QString((QString *)&local_118,"tree/markingEnabled");
  QVariant::QVariant((QVariant *)&local_d8,true);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  bVar7 = (bool)QVariant::toBool();
  this->markingEnabled = bVar7;
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QAction::setChecked(SUB81(*(undefined8 *)(this->ui + 0xd8),0));
  local_118.d = (Data *)0x0;
  local_118.ptr = (char16_t *)0x0;
  local_118.size = 0;
  QString::QString((QString *)&local_38,"mainWindow/fontName");
  QString::QString((QString *)&local_50,"Courier New");
  QVariant::QVariant((QVariant *)&local_d8,(QString *)&local_50);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  QVariant::toString();
  qVar6 = local_118.size;
  pcVar5 = local_118.ptr;
  pDVar4 = local_118.d;
  local_118.d = local_68.d;
  local_118.ptr = local_68.ptr;
  local_68.d = pDVar4;
  local_68.ptr = pcVar5;
  local_118.size = local_68.size;
  local_68.size = qVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QString::QString((QString *)&local_68,"mainWindow/fontSize");
  QVariant::QVariant((QVariant *)&local_d8,10);
  QSettings::value((QString *)local_f8.data,(QVariant *)&settings);
  iVar9 = QVariant::toInt((bool *)local_f8.data);
  QVariant::~QVariant((QVariant *)&local_f8);
  QVariant::~QVariant((QVariant *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QFont::QFont((QFont *)local_f8.data,(QString *)&local_118,iVar9,-1,false);
  pPVar3 = *(PrivateShared **)&this->currentFont;
  *(PrivateShared **)&this->currentFont = local_f8.shared;
  uVar1 = *(undefined4 *)&this->field_0xd8;
  *(undefined4 *)&this->field_0xd8 = local_f8._8_4_;
  local_f8.shared = pPVar3;
  local_f8._8_4_ = uVar1;
  QFont::~QFont((QFont *)local_f8.data);
  QFont::setStyleHint(&this->currentFont,7,1);
  QApplication::setFont(&this->currentFont,(char *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QArrayDataPointer<int>::~QArrayDataPointer(&vertList.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&horList.d);
  QSettings::~QSettings(&settings);
  return;
}

Assistant:

void UEFITool::readSettings()
{
    QSettings settings(this);
    restoreGeometry(settings.value("mainWindow/geometry").toByteArray());
    restoreState(settings.value("mainWindow/windowState").toByteArray());
    QList<int> horList, vertList;
    horList.append(settings.value("mainWindow/treeWidth", 600).toInt());
    horList.append(settings.value("mainWindow/infoWidth", 180).toInt());
    vertList.append(settings.value("mainWindow/treeHeight", 400).toInt());
    vertList.append(settings.value("mainWindow/messageHeight", 180).toInt());
    ui->infoSplitter->setSizes(horList);
    ui->messagesSplitter->setSizes(vertList);
    ui->structureTreeView->setColumnWidth(0, settings.value("tree/columnWidth0", ui->structureTreeView->columnWidth(0)).toInt());
    ui->structureTreeView->setColumnWidth(1, settings.value("tree/columnWidth1", ui->structureTreeView->columnWidth(1)).toInt());
    ui->structureTreeView->setColumnWidth(2, settings.value("tree/columnWidth2", ui->structureTreeView->columnWidth(2)).toInt());
    ui->structureTreeView->setColumnWidth(3, settings.value("tree/columnWidth3", ui->structureTreeView->columnWidth(3)).toInt());
    markingEnabled = settings.value("tree/markingEnabled", true).toBool();
    ui->actionToggleBootGuardMarking->setChecked(markingEnabled);
    
    // Set monospace font
    QString fontName;
    int fontSize;
#if defined Q_OS_MACOS
    fontName = settings.value("mainWindow/fontName", QString("Menlo")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#elif defined Q_OS_WIN
    fontName = settings.value("mainWindow/fontName", QString("Consolas")).toString();
    fontSize = settings.value("mainWindow/fontSize", 9).toInt();
#else
    fontName = settings.value("mainWindow/fontName", QString("Courier New")).toString();
    fontSize = settings.value("mainWindow/fontSize", 10).toInt();
#endif
    currentFont = QFont(fontName, fontSize);
    currentFont.setStyleHint(QFont::Monospace);
    QApplication::setFont(currentFont);
}